

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

size_t __thiscall
google::protobuf::internal::MapFieldBase::SpaceUsedExcludingSelfLong(MapFieldBase *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  std::mutex::lock(&(this->mutex_).mu_);
  iVar1 = (*this->_vptr_MapFieldBase[0xc])(this);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

size_t MapFieldBase::SpaceUsedExcludingSelfLong() const {
  mutex_.Lock();
  size_t size = SpaceUsedExcludingSelfNoLock();
  mutex_.Unlock();
  return size;
}